

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Gia_ManCompareWithBest
              (Gia_Man_t *pBest,Gia_Man_t *p,int *pnBestLuts,int *pnBestEdges,int *pnBestLevels,
              int fArea)

{
  int iVar1;
  int iVar2;
  int nCurLevels;
  int nCurLuts;
  int nCurEdges;
  
  Gia_ManLutParams(p,&nCurLuts,&nCurEdges,&nCurLevels);
  if (pBest != (Gia_Man_t *)0x0) {
    iVar2 = pBest->nRegs;
    iVar1 = p->nRegs;
    if ((((pBest->vCis->nSize - iVar2 == p->vCis->nSize - iVar1) && (iVar2 == iVar1)) &&
        (pBest->vCos->nSize - iVar2 == p->vCos->nSize - iVar1)) &&
       (iVar2 = strcmp(pBest->pName,p->pName), iVar2 == 0)) {
      if (fArea == 0) {
        if (*pnBestLevels <= nCurLevels) {
          if (*pnBestLevels != nCurLevels) {
            return 0;
          }
          if (*pnBestLuts * 2 + *pnBestEdges <= nCurLuts * 2 + nCurEdges) {
            return 0;
          }
        }
      }
      else if (*pnBestLuts <= nCurLuts) {
        if (*pnBestLuts != nCurLuts) {
          return 0;
        }
        if (*pnBestLevels <= nCurLevels) {
          return 0;
        }
      }
    }
  }
  *pnBestLuts = nCurLuts;
  *pnBestEdges = nCurEdges;
  *pnBestLevels = nCurLevels;
  return 1;
}

Assistant:

static inline int Gia_ManCompareWithBest( Gia_Man_t * pBest, Gia_Man_t * p, int * pnBestLuts, int * pnBestEdges, int * pnBestLevels, int fArea )
{
    int nCurLuts, nCurEdges, nCurLevels;
    Gia_ManLutParams( p, &nCurLuts, &nCurEdges, &nCurLevels );
    if ( pBest == NULL ||
         Gia_ManPiNum(pBest) != Gia_ManPiNum(p) ||
         Gia_ManPoNum(pBest) != Gia_ManPoNum(p) ||
         Gia_ManRegNum(pBest) != Gia_ManRegNum(p) ||
         strcmp(Gia_ManName(pBest), Gia_ManName(p)) ||
         (!fArea && (*pnBestLevels > nCurLevels || (*pnBestLevels == nCurLevels && 2*(*pnBestLuts) + *pnBestEdges > 2*nCurLuts + nCurEdges))) ||
         ( fArea && (*pnBestLuts   > nCurLuts   || (*pnBestLuts   == nCurLuts   && *pnBestLevels > nCurLevels)))
       )
    {
        *pnBestLuts = nCurLuts;
        *pnBestEdges = nCurEdges;
        *pnBestLevels = nCurLevels;
        //printf( "\nUpdating best (%d %d %d).\n\n", nCurLuts, nCurEdges, nCurLevels );
        return 1;
    }
    return 0;
}